

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::iterate(CommonEdgeCase *this)

{
  long lVar1;
  _func_int **pp_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined2 uVar4;
  CaseType CVar5;
  TestLog *pTVar6;
  RenderContext *pRVar7;
  short sVar8;
  pointer pfVar9;
  unsigned_short uVar10;
  int iVar11;
  deUint32 dVar12;
  uint uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  Surface *surface;
  char *pcVar17;
  size_type sVar18;
  void *__buf;
  int n;
  int iVar19;
  long lVar20;
  int iVar21;
  int j;
  int iVar22;
  int iVar23;
  ulong uVar24;
  size_type __n;
  int i;
  int iVar25;
  long *plVar26;
  char *__s;
  bool bVar27;
  float fVar28;
  float fVar29;
  vector<unsigned_short,_std::allocator<unsigned_short>_> gridIndices;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> gridPosComps;
  vector<float,_std::allocator<float>_> gridTessParams;
  Surface rendered;
  deUint16 corners [4];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_448;
  deUint32 local_42c;
  string local_428;
  RandomViewport local_408;
  vector<float,_std::allocator<float>_> local_3f8;
  vector<float,_std::allocator<float>_> local_3d8;
  int local_3b8;
  int local_3b4;
  string local_3b0;
  long local_390;
  Surface local_388;
  TestLog *local_370;
  RenderContext *local_368;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  undefined1 local_338 [8];
  _Alloc_hider local_330;
  char local_320 [16];
  int local_310;
  VertexComponentType local_308;
  VertexComponentConversion VStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  pointer local_2f0;
  PrimitiveType local_2e8;
  long *local_2e0 [2];
  long local_2d0 [2];
  ios_base local_2c0 [8];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  pointer local_2a0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  int local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar11 = (*pRVar7->_vptr_RenderContext[4])(pRVar7);
  dVar12 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_408,(RenderTarget *)CONCAT44(extraout_var,iVar11),0x100,0x100,dVar12);
  local_42c = (((this->m_program).m_ptr)->m_program).m_program;
  local_368 = pRVar7;
  iVar11 = (*pRVar7->_vptr_RenderContext[3])(pRVar7);
  local_390 = CONCAT44(extraout_var_00,iVar11);
  sVar18 = 0xfffffffffffffff0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    sVar18 = 0x40;
  }
  __n = 0x60;
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    __n = sVar18;
  }
  local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&local_3f8,0x32);
  std::vector<float,_std::allocator<float>_>::reserve(&local_3d8,0x19);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve(&local_448,__n);
  iVar11 = 0;
  iVar25 = 0;
  do {
    fVar28 = ((float)iVar25 + 0.5 + (float)iVar25 + 0.5) / 5.0 + -1.0;
    iVar22 = 0;
    do {
      fVar29 = ((float)iVar22 + 0.5 + (float)iVar22 + 0.5) / 5.0 + -1.0;
      if (local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_338._0_4_ = fVar29;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_3f8,
                   (iterator)
                   local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_338);
      }
      else {
        *local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar29;
        local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_338._0_4_ = fVar28;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_3f8,
                   (iterator)
                   local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_338);
      }
      else {
        *local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar28;
        local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_338._0_4_ = (float)(iVar11 + iVar22) / 24.0;
      if (local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_3d8,
                   (iterator)
                   local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_338);
      }
      else {
        *local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = (float)local_338._0_4_;
        local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar22 = iVar22 + 1;
    } while (iVar22 != 5);
    iVar25 = iVar25 + 1;
    iVar11 = iVar11 + 5;
  } while (iVar25 != 5);
  local_370 = pTVar6;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    uVar13 = 0;
    uVar16 = 2;
    iVar11 = 4;
    do {
      local_360 = (ulong)uVar13;
      local_350 = (ulong)(uVar13 * 5);
      local_358 = (ulong)(uVar13 * 5 + 5);
      local_3b4 = (int)uVar16;
      uVar24 = 0;
      local_3b8 = iVar11;
      do {
        uVar13 = (int)(uVar24 / 3) * 3;
        local_340 = (ulong)uVar13;
        uVar13 = (int)uVar16 + uVar13;
        sVar8 = (short)uVar24;
        local_338._2_2_ = sVar8 + 1 + (short)local_350;
        local_338._0_2_ = sVar8 + (short)local_350;
        local_338._4_2_ = (short)local_358 + sVar8;
        local_338._6_2_ = (short)local_358 + 1 + sVar8;
        CVar5 = this->m_caseType;
        iVar25 = ((CVar5 == CASETYPE_PRECISE) - 1) + (uint)(CVar5 == CASETYPE_PRECISE);
        if (CVar5 == CASETYPE_BASIC) {
          iVar25 = 0;
        }
        iVar22 = 3;
        local_348 = uVar16;
        do {
          if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_448,
                       (iterator)
                       local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (unsigned_short *)(local_338 + (ulong)(uVar13 % 3) * 2));
          }
          else {
            *local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 *(unsigned_short *)(local_338 + (ulong)(uVar13 % 3) * 2);
            local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar13 = uVar13 + 1;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        iVar25 = iVar25 + iVar11 + (int)local_340;
        iVar22 = 0;
        do {
          if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_448,
                       (iterator)
                       local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (unsigned_short *)(local_338 + (long)((iVar25 + iVar22) % 3) * 2 + 2));
          }
          else {
            *local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 *(unsigned_short *)(local_338 + (long)((iVar25 + iVar22) % 3) * 2 + 2);
            local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          iVar22 = iVar22 + 1;
        } while (iVar22 != 3);
        uVar13 = (int)uVar24 + 1;
        uVar24 = (ulong)uVar13;
        uVar16 = (ulong)((int)local_348 - 1);
        iVar11 = iVar11 + -1;
      } while (uVar13 != 4);
      uVar13 = (int)local_360 + 1;
      uVar16 = (ulong)(local_3b4 + 1);
      iVar11 = local_3b8 + 1;
    } while (uVar13 != 4);
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    iVar11 = 0;
    do {
      iVar25 = 0;
      do {
        iVar22 = 0;
        do {
          iVar19 = 0;
          do {
            uVar10 = ((short)iVar25 + (short)iVar19 & 1U) +
                     (((short)iVar22 + (short)iVar11 & 1U) + (short)iVar11) * 5 + (short)iVar25;
            local_338._0_2_ = uVar10;
            if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_448,
                         (iterator)
                         local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_338);
            }
            else {
              *local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = uVar10;
              local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            iVar19 = iVar19 + 1;
          } while (iVar19 == 1);
          bVar27 = iVar22 == 0;
          iVar22 = iVar22 + 1;
        } while (bVar27);
        if (((this->m_caseType == CASETYPE_PRECISE) && ((iVar11 + iVar25 & 1U) == 0)) &&
           (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish + -4 <
            local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish + -1)) {
          lVar14 = (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start +
                   (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish;
          lVar20 = (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start +
                   (long)local_448.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish;
          do {
            lVar1 = lVar14 + -(long)local_448.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined2 *)(lVar1 + -8);
            uVar16 = lVar20 + -4 +
                     -(long)local_448.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start;
            *(undefined2 *)(lVar1 + -8) = *(undefined2 *)(uVar16 + 2);
            *(undefined2 *)(uVar16 + 2) = uVar4;
            lVar14 = lVar14 + 2;
            lVar20 = lVar20 + -2;
          } while (lVar1 - 6U < uVar16);
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 != 4);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 4);
  }
  lVar20 = local_390;
  (**(code **)(local_390 + 0x1a00))(local_408.x,local_408.y,local_408.width,local_408.height);
  pTVar6 = local_370;
  (**(code **)(lVar20 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar20 + 0x1680))(local_42c);
  iVar11 = 3;
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    iVar11 = (uint)(this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) * 5 + -1;
  }
  (**(code **)(lVar20 + 0xfd8))(0x8e72,iVar11);
  (**(code **)(lVar20 + 0x188))(0x4000);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"in_v_position","");
  pfVar9 = local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1b0._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  pp_Var2 = (_func_int **)(local_1a0 + 8);
  local_1a8 = pp_Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_428._M_dataplus._M_p,
             local_428._M_dataplus._M_p + local_428._M_string_length);
  local_188 = 0;
  local_338._0_4_ = local_1b0._0_4_;
  local_330._M_p = local_320;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,local_1a8,(undefined1 *)(local_1a0._0_8_ + (long)local_1a8));
  local_310 = local_188;
  local_308 = VTX_COMP_FLOAT;
  VStack_304 = VTX_COMP_CONVERT_NONE;
  iStack_300 = 2;
  iStack_2fc = 0x19;
  local_2f8 = 0;
  local_2f0 = pfVar9;
  if (local_1a8 != pp_Var2) {
    operator_delete(local_1a8,local_1a0._8_8_ + 1);
  }
  paVar3 = &local_3b0.field_2;
  local_3b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"in_v_tessParam","");
  pfVar9 = local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1b0._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_1a8 = pp_Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_3b0._M_dataplus._M_p,
             local_3b0._M_dataplus._M_p + local_3b0._M_string_length);
  local_188 = 0;
  local_2e8 = local_1b0._0_4_;
  plVar26 = local_2d0;
  local_2e0[0] = plVar26;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e0,local_1a8,(undefined1 *)(local_1a0._0_8_ + (long)local_1a8));
  local_2c0[0] = (ios_base)(undefined1)local_188;
  local_2c0[1] = (ios_base)local_188._1_1_;
  local_2c0[2] = (ios_base)local_188._2_1_;
  local_2c0[3] = (ios_base)local_188._3_1_;
  local_2b8 = 8;
  uStack_2b0 = 0x1900000001;
  local_2a8 = 0;
  local_2a0 = pfVar9;
  if (local_1a8 != pp_Var2) {
    operator_delete(local_1a8,local_1a0._8_8_ + 1);
  }
  pRVar7 = local_368;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  local_1b0._4_4_ =
       (int)((ulong)((long)local_448.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_448.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 1);
  local_1b0._0_4_ = 7;
  local_1a8 = (_func_int **)CONCAT44(local_1a8._4_4_,INDEXTYPE_UINT16);
  local_1a0._0_8_ =
       local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  glu::draw(pRVar7,local_42c,2,(VertexArrayBinding *)local_338,(PrimitiveList *)local_1b0,
            (DrawUtilCallback *)0x0);
  dVar12 = (**(code **)(local_390 + 0x800))();
  glu::checkError(dVar12,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x71c);
  lVar20 = -0xa0;
  do {
    if (plVar26 != (long *)plVar26[-2]) {
      operator_delete((long *)plVar26[-2],*plVar26 + 1);
    }
    plVar26 = plVar26 + -10;
    lVar20 = lVar20 + 0x50;
  } while (lVar20 != 0);
  getPixels(&local_388,pRVar7,local_408.x,local_408.y,local_408.width,local_408.height);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"RenderedImage","");
  local_3b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"Rendered Image","");
  surface = &local_388;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_428,&local_3b0,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar6,__buf,(size_t)surface);
  local_338 = (undefined1  [8])pTVar6;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_330,
             "Note: coloring is done to clarify the positioning and orientation of the ",0x49);
  pcVar17 = (char *)0x0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar17 = "quads";
  }
  __s = "triangles";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    __s = pcVar17;
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_330 + (int)*(undefined8 *)(local_330._M_p + -0x18))
    ;
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_330,
             "; the color of a vertex corresponds to the index of that vertex in the patch",0x4c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if (this->m_caseType == CASETYPE_PRECISE) {
    local_338 = (undefined1  [8])pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,
               "Note: the \'precise\' qualifier is used to avoid cracks between primitives",0x48);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_caseType != CASETYPE_BASIC) goto LAB_0143d1e8;
    local_338 = (undefined1  [8])pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,
               "Note: each shared vertex has the same index among the primitives it belongs to",0x4e
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
LAB_0143d1e8:
  iVar25 = (int)((float)local_388.m_height * 0.15);
  iVar11 = (int)((float)local_388.m_height * 0.85);
  bVar27 = iVar25 < iVar11;
  if (iVar25 < iVar11) {
    iVar22 = (int)((float)local_388.m_width * 0.85);
    iVar19 = (int)((float)local_388.m_width * 0.15);
    iVar21 = iVar25 * local_388.m_width;
    do {
      lVar20 = (long)iVar22 - (long)iVar19;
      iVar23 = iVar19;
      if (iVar19 < iVar22) {
        do {
          if ((*(uint *)((long)local_388.m_pixels.m_ptr + (long)(iVar21 + iVar23) * 4) & 0xffffff)
              == 0) {
            local_1b0 = (undefined1  [8])pTVar6;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,
                       "Failure: there seem to be cracks in the rendered result",0x37);
            local_338 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_330,"Note: pixel with zero r, g and b channels found at ",
                       0x33);
            local_428._M_dataplus._M_p._4_4_ = iVar25;
            local_428._M_dataplus._M_p._0_4_ = iVar23;
            tcu::operator<<((ostream *)&local_330,(Vector<int,_2> *)&local_428);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
            std::ios_base::~ios_base(local_2c0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Image verification failed");
            if (!bVar27) goto LAB_0143d384;
            tcu::Surface::~Surface(&local_388);
            goto LAB_0143d405;
          }
          lVar20 = lVar20 + -1;
          iVar23 = iVar23 + 1;
        } while (lVar20 != 0);
      }
      iVar25 = iVar25 + 1;
      iVar21 = iVar21 + local_388.m_width;
      bVar27 = iVar25 < iVar11;
    } while (iVar25 != iVar11);
  }
LAB_0143d384:
  local_338 = (undefined1  [8])pTVar6;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_330,"Success: there seem to be no cracks in the rendered result",0x3a
            );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
  tcu::Surface::~Surface(&local_388);
  if (!bVar27) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
LAB_0143d405:
  if (local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

CommonEdgeCase::IterateResult CommonEdgeCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	const int					gridWidth				= 4;
	const int					gridHeight				= 4;
	const int					numVertices				= (gridWidth+1)*(gridHeight+1);
	const int					numIndices				= gridWidth*gridHeight * (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3*2 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
	const int					numPosCompsPerVertex	= 2;
	const int					totalNumPosComps		= numPosCompsPerVertex*numVertices;
	vector<float>				gridPosComps;
	vector<float>				gridTessParams;
	vector<deUint16>			gridIndices;

	gridPosComps.reserve(totalNumPosComps);
	gridTessParams.reserve(numVertices);
	gridIndices.reserve(numIndices);

	{
		for (int i = 0; i < gridHeight+1; i++)
		for (int j = 0; j < gridWidth+1; j++)
		{
			gridPosComps.push_back(-1.0f + 2.0f * ((float)j + 0.5f) / (float)(gridWidth+1));
			gridPosComps.push_back(-1.0f + 2.0f * ((float)i + 0.5f) / (float)(gridHeight+1));
			gridTessParams.push_back((float)(i*(gridWidth+1) + j) / (float)(numVertices-1));
		}
	}

	// Generate patch vertex indices.
	// \note If CASETYPE_BASIC, the vertices are ordered such that when multiple
	//		 triangles/quads share a vertex, it's at the same index for everyone.

	if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			const deUint16 corners[4] =
			{
				(deUint16)((i+0)*(gridWidth+1) + j+0),
				(deUint16)((i+0)*(gridWidth+1) + j+1),
				(deUint16)((i+1)*(gridWidth+1) + j+0),
				(deUint16)((i+1)*(gridWidth+1) + j+1)
			};

			const int secondTriangleVertexIndexOffset = m_caseType == CASETYPE_BASIC	? 0
													  : m_caseType == CASETYPE_PRECISE	? 1
													  : -1;
			DE_ASSERT(secondTriangleVertexIndexOffset != -1);

			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+0 + i + (2-j%3)) % 3]);
			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+2 + i + (2-j%3) + secondTriangleVertexIndexOffset) % 3 + 1]);
		}
	}
	else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			// \note The vertices are ordered such that when multiple quads
			//		 share a vertices, it's at the same index for everyone.
			for (int m = 0; m < 2; m++)
			for (int n = 0; n < 2; n++)
				gridIndices.push_back((deUint16)((i+(i+m)%2)*(gridWidth+1) + j+(j+n)%2));

			if(m_caseType == CASETYPE_PRECISE && (i+j) % 2 == 0)
				std::reverse(gridIndices.begin() + (gridIndices.size() - 4),
							 gridIndices.begin() + gridIndices.size());
		}
	}
	else
		DE_ASSERT(false);

	DE_ASSERT((int)gridPosComps.size() == totalNumPosComps);
	DE_ASSERT((int)gridTessParams.size() == numVertices);
	DE_ASSERT((int)gridIndices.size() == numIndices);

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	{
		gl.patchParameteri(GL_PATCH_VERTICES, m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_position", numPosCompsPerVertex, numVertices, 0, &gridPosComps[0]),
			glu::va::Float("in_v_tessParam", 1, numVertices, 0, &gridTessParams[0])
		};

		glu::draw(renderCtx, programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches((int)gridIndices.size(), &gridIndices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface rendered = getPixels(renderCtx, viewport);

		log << TestLog::Image("RenderedImage", "Rendered Image", rendered)
			<< TestLog::Message << "Note: coloring is done to clarify the positioning and orientation of the "
								<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "triangles" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "quads" : DE_NULL)
								<< "; the color of a vertex corresponds to the index of that vertex in the patch"
								<< TestLog::EndMessage;

		if (m_caseType == CASETYPE_BASIC)
			log << TestLog::Message << "Note: each shared vertex has the same index among the primitives it belongs to" << TestLog::EndMessage;
		else if (m_caseType == CASETYPE_PRECISE)
			log << TestLog::Message << "Note: the 'precise' qualifier is used to avoid cracks between primitives" << TestLog::EndMessage;
		else
			DE_ASSERT(false);

		// Ad-hoc result verification - check that a certain rectangle in the image contains no black pixels.

		const int startX	= (int)(0.15f * (float)rendered.getWidth());
		const int endX		= (int)(0.85f * (float)rendered.getWidth());
		const int startY	= (int)(0.15f * (float)rendered.getHeight());
		const int endY		= (int)(0.85f * (float)rendered.getHeight());

		for (int y = startY; y < endY; y++)
		for (int x = startX; x < endX; x++)
		{
			const tcu::RGBA pixel = rendered.getPixel(x, y);

			if (pixel.getRed() == 0 && pixel.getGreen() == 0 && pixel.getBlue() == 0)
			{
				log << TestLog::Message << "Failure: there seem to be cracks in the rendered result" << TestLog::EndMessage
					<< TestLog::Message << "Note: pixel with zero r, g and b channels found at " << tcu::IVec2(x, y) << TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				return STOP;
			}
		}

		log << TestLog::Message << "Success: there seem to be no cracks in the rendered result" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}